

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

size_t CLI::detail::close_string_quote(string *str,size_t start,char closure_char)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_28;
  size_t loc;
  char closure_char_local;
  size_t start_local;
  string *str_local;
  
  local_28 = start + 1;
  while ((uVar1 = ::std::__cxx11::string::size(), local_28 < uVar1 &&
         (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar2 != closure_char))
        ) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar2 == '\\') {
      local_28 = local_28 + 1;
    }
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

CLI11_INLINE std::size_t close_string_quote(const std::string &str, std::size_t start, char closure_char) {
    std::size_t loc{0};
    for(loc = start + 1; loc < str.size(); ++loc) {
        if(str[loc] == closure_char) {
            break;
        }
        if(str[loc] == '\\') {
            // skip the next character for escaped sequences
            ++loc;
        }
    }
    return loc;
}